

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgToken.hpp
# Opt level: O1

TokenStream * __thiscall rsg::TokenStream::operator<<(TokenStream *this,Token *token)

{
  if ((long)(this->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_start >> 4 == this->m_numTokens) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
              (&this->m_tokens,this->m_numTokens + 0x40);
  }
  Token::operator=((this->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                   _M_impl.super__Vector_impl_data._M_start + this->m_numTokens,token);
  this->m_numTokens = this->m_numTokens + 1;
  return this;
}

Assistant:

inline TokenStream& TokenStream::operator<< (const Token& token)
{
	if (m_tokens.size() == m_numTokens)
		m_tokens.resize(m_numTokens+ALLOC_SIZE);

	m_tokens[m_numTokens]	 = token;
	m_numTokens				+= 1;

	return *this;
}